

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

void __thiscall PSEngine::print_subturns_history(PSEngine *this)

{
  AbsoluteDirection AVar1;
  ObjectDeltaType p_enum_value;
  const_reference this_00;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pRVar5;
  element_type *peVar6;
  element_type *peVar7;
  vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
  *this_01;
  vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_> *this_02;
  element_type *peVar8;
  string local_788 [32];
  string local_768 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
  local_748;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  byte local_6aa;
  allocator<char> local_6a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  string local_668;
  string local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  reference local_5a8;
  ObjectDelta *object_delta;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_> *__range5_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  reference local_488;
  PatternMatchInformation *m;
  const_iterator __end5;
  const_iterator __begin5;
  vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
  *__range5;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  undefined1 local_410 [8];
  string rule_match_str;
  RuleApplicationDelta *rule_app_delta;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  *__range4_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
  local_230;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  byte local_192;
  allocator<char> local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  reference local_150;
  MovementDelta *move_delta;
  const_iterator __end4;
  const_iterator __begin4;
  vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_> *__range4;
  RuleDelta *rule_delta;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_> *__range2;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  const_reference local_50;
  value_type *subturn;
  int i;
  allocator<char> local_31;
  string local_30 [8];
  string result;
  PSEngine *this_local;
  
  result.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  for (subturn._0_4_ = 0; uVar3 = (ulong)(int)subturn,
      sVar4 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::size
                        (&(this->m_turn_history).subturns), uVar3 < sVar4;
      subturn._0_4_ = (int)subturn + 1) {
    local_50 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::
               operator[](&(this->m_turn_history).subturns,(long)(int)subturn);
    std::__cxx11::to_string(&local_f0,(int)subturn + 1);
    std::operator+(&local_d0,"--- Subturn ",&local_f0);
    std::operator+(&local_b0,&local_d0,"/");
    sVar4 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::size
                      (&(this->m_turn_history).subturns);
    std::__cxx11::to_string((string *)&__range2,sVar4);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    std::operator+(&local_70,&local_90,"---\n");
    std::__cxx11::string::operator+=(local_30,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_00 = local_50;
    __end2 = std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::begin
                       (&local_50->steps);
    rule_delta = (RuleDelta *)
                 std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::end
                           (&this_00->steps);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_PSEngine::RuleDelta_*,_std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>_>
                                       *)&rule_delta), bVar2) {
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_PSEngine::RuleDelta_*,_std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>_>
               ::operator*(&__end2);
      if ((pRVar5->is_movement_resolution & 1U) == 0) {
        CompiledGame::Rule::to_string_abi_cxx11_((string *)&__range4_1,&pRVar5->rule_applied,false);
        std::operator+(&local_3b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range4_1,"\n");
        std::__cxx11::string::operator+=(local_30,(string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&__range4_1);
        __end4_1 = std::
                   vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                   ::begin(&pRVar5->rule_application_deltas);
        rule_app_delta =
             (RuleApplicationDelta *)
             std::
             vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
             ::end(&pRVar5->rule_application_deltas);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<const_PSEngine::RuleApplicationDelta_*,_std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>_>
                                   *)&rule_app_delta), bVar2) {
          rule_match_str.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<const_PSEngine::RuleApplicationDelta_*,_std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>_>
               ::operator*(&__end4_1);
          AVar1 = ((reference)rule_match_str.field_2._8_8_)->rule_direction;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                 *)&__range5,&to_absolute_direction_abi_cxx11_);
          enum_to_str<PSEngine::AbsoluteDirection>
                    (&local_438,AVar1,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                      *)&__range5);
          std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                     (optional<std::__cxx11::string> *)&local_438,(char (*) [6])0x1b622d);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_438);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                  *)&__range5);
          this_01 = (vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                     *)(rule_match_str.field_2._8_8_ + 8);
          __end5 = std::
                   vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                   ::begin(this_01);
          m = (PatternMatchInformation *)
              std::
              vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
              ::end(this_01);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_PSEngine::PatternMatchInformation_*,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>_>
                                             *)&m), bVar2) {
            local_488 = __gnu_cxx::
                        __normal_iterator<const_PSEngine::PatternMatchInformation_*,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>_>
                        ::operator*(&__end5);
            std::__cxx11::to_string(&local_528,(local_488->origin).x);
            std::operator+(&local_508," (",&local_528);
            std::operator+(&local_4e8,&local_508,",");
            std::__cxx11::to_string(&local_548,(local_488->origin).y);
            std::operator+(&local_4c8,&local_4e8,&local_548);
            std::operator+(&local_4a8,&local_4c8,") ");
            std::__cxx11::string::operator+=((string *)local_410,(string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_548);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::__cxx11::string::~string((string *)&local_508);
            std::__cxx11::string::~string((string *)&local_528);
            __gnu_cxx::
            __normal_iterator<const_PSEngine::PatternMatchInformation_*,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>_>
            ::operator++(&__end5);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range5_1,"\t",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_410);
          std::operator+(&local_568,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range5_1,"\n");
          std::__cxx11::string::operator+=(local_30,(string *)&local_568);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&__range5_1);
          this_02 = (vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_> *)
                    (rule_match_str.field_2._8_8_ + 0x20);
          __end5_1 = std::vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>::
                     begin(this_02);
          object_delta = (ObjectDelta *)
                         std::vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>
                         ::end(this_02);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5_1,
                                    (__normal_iterator<const_PSEngine::ObjectDelta_*,_std::vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>_>
                                     *)&object_delta), bVar2) {
            local_5a8 = __gnu_cxx::
                        __normal_iterator<const_PSEngine::ObjectDelta_*,_std::vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>_>
                        ::operator*(&__end5_1);
            std::__cxx11::to_string(&local_648,(local_5a8->cell_position).x);
            std::operator+(&local_628,"\t\t",&local_648);
            std::operator+(&local_608,&local_628,",");
            std::__cxx11::to_string(&local_668,(local_5a8->cell_position).y);
            std::operator+(&local_5e8,&local_608,&local_668);
            std::operator+(&local_5c8,&local_5e8," ");
            std::__cxx11::string::operator+=(local_30,(string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_5e8);
            std::__cxx11::string::~string((string *)&local_668);
            std::__cxx11::string::~string((string *)&local_608);
            std::__cxx11::string::~string((string *)&local_628);
            std::__cxx11::string::~string((string *)&local_648);
            peVar6 = std::__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>::get
                               (&(local_5a8->object).
                                 super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                               );
            local_6aa = 0;
            if (peVar6 == (element_type *)0x0) {
              std::allocator<char>::allocator();
              local_6aa = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6a8,"nullptr",&local_6a9);
            }
            else {
              peVar7 = std::
                       __shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&local_5a8->object);
              std::__cxx11::string::string
                        ((string *)&local_6a8,(string *)&(peVar7->super_Object).identifier);
            }
            std::operator+(&local_688,&local_6a8," ");
            std::__cxx11::string::operator+=(local_30,(string *)&local_688);
            std::__cxx11::string::~string((string *)&local_688);
            std::__cxx11::string::~string((string *)&local_6a8);
            if ((local_6aa & 1) != 0) {
              std::allocator<char>::~allocator(&local_6a9);
            }
            p_enum_value = local_5a8->type;
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
            ::map(&local_748,&CompiledGame::to_object_delta_type_abi_cxx11_);
            enum_to_str<CompiledGame::ObjectDeltaType>(&local_718,p_enum_value,&local_748);
            std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                      (&local_6f0,(optional<std::__cxx11::string> *)&local_718,(char (*) [6])"ERROR"
                      );
            std::operator+(&local_6d0,&local_6f0,"\n");
            std::__cxx11::string::operator+=(local_30,(string *)&local_6d0);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::__cxx11::string::~string((string *)&local_6f0);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional(&local_718);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
            ::~map(&local_748);
            __gnu_cxx::
            __normal_iterator<const_PSEngine::ObjectDelta_*,_std::vector<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>_>
            ::operator++(&__end5_1);
          }
          std::__cxx11::string::~string((string *)local_410);
          __gnu_cxx::
          __normal_iterator<const_PSEngine::RuleApplicationDelta_*,_std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>_>
          ::operator++(&__end4_1);
        }
      }
      else {
        std::__cxx11::string::operator+=(local_30,"Movement Resolution\n");
        __end4 = std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>::
                 begin(&pRVar5->movement_deltas);
        move_delta = (MovementDelta *)
                     std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>
                     ::end(&pRVar5->movement_deltas);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_PSEngine::MovementDelta_*,_std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>_>
                                           *)&move_delta), bVar2) {
          local_150 = __gnu_cxx::
                      __normal_iterator<const_PSEngine::MovementDelta_*,_std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>_>
                      ::operator*(&__end4);
          std::__cxx11::string::operator+=(local_30,"\t");
          peVar6 = std::__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(local_150->object).
                               super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                             );
          local_192 = 0;
          if (peVar6 == (element_type *)0x0) {
            std::allocator<char>::allocator();
            local_192 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_190,"nullptr",&local_191);
          }
          else {
            peVar7 = std::
                     __shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&local_150->object);
            std::__cxx11::string::string
                      ((string *)&local_190,(string *)&(peVar7->super_Object).identifier);
          }
          std::operator+(&local_170,&local_190," ");
          std::__cxx11::string::operator+=(local_30,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_190);
          if ((local_192 & 1) != 0) {
            std::allocator<char>::~allocator(&local_191);
          }
          AVar1 = local_150->move_direction;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::map(&local_230,&to_absolute_direction_abi_cxx11_);
          enum_to_str<PSEngine::AbsoluteDirection>(&local_200,AVar1,&local_230);
          std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                    (&local_1d8,(optional<std::__cxx11::string> *)&local_200,(char (*) [6])"ERROR");
          std::operator+(&local_1b8,"moved ",&local_1d8);
          std::__cxx11::string::operator+=(local_30,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_200);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
          ::~map(&local_230);
          std::__cxx11::to_string(&local_2b0,(local_150->origin).x);
          std::operator+(&local_290," from (",&local_2b0);
          std::operator+(&local_270,&local_290,",");
          std::__cxx11::to_string(&local_2d0,(local_150->origin).y);
          std::operator+(&local_250,&local_270,&local_2d0);
          std::__cxx11::string::operator+=(local_30,(string *)&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::to_string(&local_370,(local_150->destination).x);
          std::operator+(&local_350,") to (",&local_370);
          std::operator+(&local_330,&local_350,",");
          std::__cxx11::to_string(&local_390,(local_150->destination).y);
          std::operator+(&local_310,&local_330,&local_390);
          std::operator+(&local_2f0,&local_310,")\n");
          std::__cxx11::string::operator+=(local_30,(string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          __gnu_cxx::
          __normal_iterator<const_PSEngine::MovementDelta_*,_std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>_>
          ::operator++(&__end4);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_PSEngine::RuleDelta_*,_std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>_>
      ::operator++(&__end2);
    }
  }
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar8 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_logger);
    std::__cxx11::string::string(local_768,(string *)&m_engine_log_cat_abi_cxx11_);
    std::__cxx11::string::string(local_788,local_30);
    (*peVar8->_vptr_PSLogger[2])(peVar8,2,local_768,local_788);
    std::__cxx11::string::~string(local_788);
    std::__cxx11::string::~string(local_768);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void PSEngine::print_subturns_history() const
{
    string result = "";
    for(int i = 0; i < m_turn_history.subturns.size(); ++i)
    {
        const auto& subturn = m_turn_history.subturns[i];
        result += "--- Subturn " + to_string(i+1) + "/" + to_string(m_turn_history.subturns.size()) + "---\n";
        for(const auto& rule_delta : subturn.steps)
        {
            if(rule_delta.is_movement_resolution)
            {
                result += "Movement Resolution\n";
                for(const auto& move_delta : rule_delta.movement_deltas)
                {
                    result += "\t";
                    result += (move_delta.object.get() != nullptr ? move_delta.object->identifier : "nullptr") + " ";
                    result += "moved " + enum_to_str(move_delta.move_direction,to_absolute_direction).value_or("ERROR");
                    result += " from ("+ to_string(move_delta.origin.x)+","+to_string(move_delta.origin.y);
                    result += ") to ("+to_string(move_delta.destination.x)+","+to_string(move_delta.destination.y)+")\n";
                }
            }
            else
            {
                result += rule_delta.rule_applied.to_string()+"\n";
                for(const auto& rule_app_delta : rule_delta.rule_application_deltas)
                {
                    string rule_match_str = enum_to_str(rule_app_delta.rule_direction, to_absolute_direction).value_or("error");
                    for(const auto& m : rule_app_delta.match_infos)
                    {
                        rule_match_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                    }

                    result += "\t" + rule_match_str + "\n";
                    for(const auto& object_delta : rule_app_delta.object_deltas)
                    {
                        result += "\t\t" + to_string(object_delta.cell_position.x)+","+to_string(object_delta.cell_position.y)+" ";
                        result += (object_delta.object.get() != nullptr ? object_delta.object->identifier : "nullptr") + " ";
                        result += enum_to_str(object_delta.type,CompiledGame::to_object_delta_type).value_or("ERROR") + "\n";
                    }
                }
            }
        }
    }

    PS_LOG(result);
}